

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O0

string * __thiscall
cmUuid::FromMd5(string *__return_storage_ptr__,cmUuid *this,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace,string *name)

{
  uchar *puVar1;
  size_type sz;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> digest;
  cmCryptoHash md5;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> hashInput;
  string *name_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *uuidNamespace_local;
  cmUuid *this_local;
  
  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)name;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  CreateHashInput(this,uuidNamespace,
                  (string *)
                  hashInput.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  cmCryptoHash::cmCryptoHash
            ((cmCryptoHash *)
             &digest.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,AlgoMD5);
  cmCryptoHash::Initialize
            ((cmCryptoHash *)
             &digest.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  sz = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  cmCryptoHash::Append
            ((cmCryptoHash *)
             &digest.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,puVar1,sz);
  cmCryptoHash::Finalize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,
             (cmCryptoHash *)
             &digest.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  FromDigest_abi_cxx11_(__return_storage_ptr__,this,puVar1,'\x03');
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78);
  cmCryptoHash::~cmCryptoHash
            ((cmCryptoHash *)
             &digest.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::FromMd5(std::vector<unsigned char> const& uuidNamespace,
                            std::string const& name) const
{
  std::vector<unsigned char> hashInput;
  this->CreateHashInput(uuidNamespace, name, hashInput);

  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(hashInput.data(), hashInput.size());
  std::vector<unsigned char> digest = md5.Finalize();

  return this->FromDigest(digest.data(), 3);
}